

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

void at(tagval *args,int numargs)

{
  char *__n;
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  tagval *ptVar4;
  long lVar5;
  char *__dest;
  int iVar6;
  anon_union_8_5_08252708_for_identval_0 aVar7;
  ulong uVar8;
  char *start;
  char *end;
  char *list;
  anon_union_8_5_08252708_for_identval_0 local_58;
  char *local_50;
  tagval *local_48;
  ulong local_40;
  anon_union_8_5_08252708_for_identval_0 local_38;
  
  if (numargs != 0) {
    aVar7.s = "";
    local_48 = args;
    switch(args->type) {
    case 1:
      retidx = retidx + ((retidx + 1U) / 3) * -3 + 1;
      local_58.s = retbuf[(uint)retidx];
      stringformatter::operator()
                ((stringformatter *)&local_58,"%d",(ulong)(uint)(args->super_identval).field_0.i);
      aVar7.s = retbuf[(uint)retidx];
      break;
    case 2:
      aVar7.s = floatstr((args->super_identval).field_0.f);
      break;
    case 3:
    case 6:
      aVar7 = (anon_union_8_5_08252708_for_identval_0)(args->super_identval).field_0.s;
    }
    local_58 = aVar7;
    sVar3 = strlen(aVar7.s);
    local_50 = aVar7.s + sVar3;
    if (1 < numargs) {
      uVar8 = 1;
      local_40 = (ulong)(uint)numargs;
      do {
        local_38.s = local_58.s;
        iVar6 = 0;
        if (local_48[uVar8].type - 1U < 6) {
          ptVar4 = local_48 + uVar8;
          iVar6 = 0;
          switch(local_48[uVar8].type) {
          case 1:
            iVar6 = (ptVar4->super_identval).field_0.i;
            break;
          case 2:
            iVar6 = (int)(ptVar4->super_identval).field_0.f;
            break;
          default:
            lVar5 = strtol((ptVar4->super_identval).field_0.s,(char **)0x0,0);
            iVar6 = (int)lVar5;
            break;
          case 4:
          case 5:
            break;
          }
        }
        if (0 < iVar6) {
          iVar6 = iVar6 + 1;
          do {
            bVar2 = parselist(&local_38.s,&liststart,&listend,&listquotestart,&listquoteend);
            if (!bVar2) goto LAB_0012d1bc;
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
        }
        bVar2 = parselist(&local_38.s,&local_58.s,&local_50,&listquotestart,&listquoteend);
        if (!bVar2) {
LAB_0012d1bc:
          local_50 = "";
          local_58.s = "";
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != local_40);
    }
    pcVar1 = local_50;
    aVar7 = local_58;
    ptVar4 = commandret;
    __n = local_50 + (1 - (long)local_58);
    __dest = (char *)operator_new__((ulong)__n);
    strncpy(__dest,aVar7.s,(size_t)__n);
    pcVar1[(long)__dest - (long)aVar7] = '\0';
    ptVar4->type = 3;
    (ptVar4->super_identval).field_0.s = __dest;
  }
  return;
}

Assistant:

void at(tagval *args, int numargs)
{
    if(!numargs) return;
    const char *start = args[0].getstr(), *end = start + strlen(start);
    for(int i = 1; i < numargs; i++)
    {
        const char *list = start;
        int pos = args[i].getint();
        for(; pos > 0; pos--) if(!parselist(list)) break;
        if(pos > 0 || !parselist(list, start, end)) start = end = "";
    }
    commandret->setstr(newstring(start, end-start));
}